

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1373::run(TestCase1373 *this)

{
  size_t sVar1;
  SegmentReader *pSVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  byte *pbVar5;
  SegmentBuilder *pSVar6;
  uint uVar7;
  int iVar8;
  undefined1 auVar9 [8];
  SegmentBuilder *pSVar10;
  char *pcVar11;
  uint *params_1;
  uint *puVar12;
  uint i_1;
  size_t newSize;
  char *__s1;
  long lVar13;
  uint i;
  long lVar14;
  bool bVar15;
  Orphanage OVar16;
  Builder BVar17;
  Reader RVar18;
  Reader RVar19;
  ReaderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> reader;
  Vector<capnp::Orphan<capnp::Text>_> pointers;
  BuilderFor<capnp::List<capnp::Text,_(capnp::Kind)1>_> builder;
  MallocMessageBuilder message;
  char local_22c [4];
  PointerReader local_228;
  ListReader local_208;
  ArrayPtr<const_char> local_1d8;
  undefined8 *local_1c8;
  undefined1 local_1b8 [8];
  SegmentBuilder *pSStack_1b0;
  SegmentBuilder *local_1a8;
  ArrayDisposer *local_1a0;
  ListBuilder local_198;
  OrphanBuilder local_170;
  OrphanBuilder local_150;
  ArrayPtr<const_char> local_130;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  local_1b8 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x20,0,7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  auVar9 = (undefined1  [8])local_1b8;
  local_1a8 = (SegmentBuilder *)((long)local_1b8 + 0xe0);
  local_1a0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_170.tag.content = (ulong)local_170.tag.content._4_4_ << 0x20;
  pSStack_1b0 = (SegmentBuilder *)local_1b8;
  do {
    OVar16 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&local_228,(kj *)"foo",(char (*) [4])&local_170,(uint *)auVar9);
    auVar9 = (undefined1  [8])(SegmentBuilder *)0x31ccc1;
    if ((SegmentBuilder *)local_228.capTable != (SegmentBuilder *)0x0) {
      auVar9 = (undefined1  [8])local_228.segment;
    }
    OrphanBuilder::copy((EVP_PKEY_CTX *)&local_208,(EVP_PKEY_CTX *)OVar16.arena);
    pbVar5 = local_208.ptr;
    pCVar4 = local_208.capTable;
    pSVar3 = local_208.segment;
    local_198.capTable = (CapTableBuilder *)local_208.capTable;
    local_198.ptr = local_208.ptr;
    sVar1 = CONCAT44(local_208.step,local_208.elementCount);
    local_198.segment = (SegmentBuilder *)local_208.segment;
    if (pSStack_1b0 == local_1a8) {
      newSize = (long)pSStack_1b0 - (long)local_1b8 >> 4;
      if ((undefined1  [8])pSStack_1b0 == local_1b8) {
        newSize = 4;
      }
      auVar9 = local_1b8;
      kj::Vector<capnp::Orphan<capnp::Text>_>::setCapacity
                ((Vector<capnp::Orphan<capnp::Text>_> *)local_1b8,newSize);
    }
    pSVar10 = (SegmentBuilder *)local_228.capTable;
    pSVar2 = local_228.segment;
    *(CapTableReader **)&(pSStack_1b0->super_SegmentReader).id = pCVar4;
    (pSStack_1b0->super_SegmentReader).ptr.ptr = (word *)pbVar5;
    (pSStack_1b0->super_SegmentReader).ptr.size_ = sVar1;
    (pSStack_1b0->super_SegmentReader).arena = (Arena *)pSVar3;
    pSStack_1b0 = (SegmentBuilder *)&(pSStack_1b0->super_SegmentReader).readLimiter;
    local_198.capTable = (CapTableBuilder *)0x0;
    local_198.elementCount = 0;
    local_198.step = 0;
    if ((SegmentBuilder *)local_228.segment != (SegmentBuilder *)0x0) {
      local_228.segment = (SegmentReader *)0x0;
      local_228.capTable = (CapTableReader *)0x0;
      (**(code **)*local_228.pointer)(local_228.pointer,pSVar2,1,pSVar10,pSVar10,0);
      auVar9 = (undefined1  [8])pSVar10;
    }
    uVar7 = (uint)local_170.tag.content + 1;
    local_170.tag.content._0_4_ = uVar7;
  } while (uVar7 < 7);
  OVar16 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_208,OVar16.arena,OVar16.capTable,7,POINTER);
  local_170.segment = (SegmentBuilder *)local_208.capTable;
  local_170.capTable = (CapTableBuilder *)local_208.ptr;
  local_170.tag.content = (uint64_t)local_208.segment;
  OrphanBuilder::asList(&local_198,&local_170,POINTER);
  lVar13 = 0;
  lVar14 = 0;
  do {
    local_208.ptr =
         (byte *)((long)&((WireValue<uint32_t> *)local_198.ptr)->value +
                 (((ulong)local_198._24_8_ >> 0x20) * lVar14 >> 3));
    local_208.segment = &(local_198.segment)->super_SegmentReader;
    local_208.capTable = &(local_198.capTable)->super_CapTableReader;
    PointerBuilder::adopt
              ((PointerBuilder *)&local_208,
               (OrphanBuilder *)((long)&((SegmentReader *)local_1b8)->arena + lVar13));
    lVar14 = lVar14 + 1;
    lVar13 = lVar13 + 0x20;
  } while (lVar14 != 7);
  OVar16 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  pcVar11 = (char *)0x1;
  OrphanBuilder::initData((OrphanBuilder *)&local_208,OVar16.arena,OVar16.capTable,1);
  local_150.segment = (SegmentBuilder *)local_208.capTable;
  local_150.capTable = (CapTableBuilder *)local_208.ptr;
  local_150.tag.content = (uint64_t)local_208.segment;
  BVar17 = OrphanBuilder::asData(&local_150);
  *BVar17.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanBuilder::truncate(&local_170,(char *)0xb,6);
  OrphanBuilder::asListReader(&local_208,&local_170,POINTER);
  if ((local_208.elementCount != 0xb) &&
     (pcVar11 = (char *)&kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
    local_228.segment = (SegmentReader *)CONCAT44(local_228.segment._4_4_,0xb);
    local_1d8.ptr._0_4_ = local_208.elementCount;
    pcVar11 = "\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()";
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x572,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_228,
               (uint *)&local_1d8);
  }
  local_22c[0] = '\0';
  local_22c[1] = '\0';
  local_22c[2] = '\0';
  local_22c[3] = '\0';
  do {
    kj::str<char_const(&)[4],unsigned_int&>
              ((String *)&local_1d8,(kj *)"foo",&local_22c,(uint *)pcVar11);
    local_228.pointer =
         (WirePointer *)
         ((long)&((WireValue<uint32_t> *)local_208.ptr)->value +
         ((ulong)local_208.step * (ulong)(uint)local_22c >> 3));
    local_228.segment = local_208.segment;
    local_228.capTable = local_208.capTable;
    local_228.nestingLimit = local_208.nestingLimit;
    RVar18 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    puVar12 = (uint *)local_1d8.size_;
    params_1 = (uint *)(local_1d8.size_ + ((uint *)local_1d8.size_ == (uint *)0x0));
    pcVar11 = local_1d8.ptr;
    if (params_1 == RVar18.super_StringPtr.content.size_) {
      params_1 = (uint *)0x31ccc1;
      __s1 = local_1d8.ptr;
      if ((uint *)local_1d8.size_ == (uint *)0x0) {
        __s1 = "";
      }
      iVar8 = bcmp(__s1,RVar18.super_StringPtr.content.ptr,
                   (size_t)((long)RVar18.super_StringPtr.content.size_ + -1));
      bVar15 = iVar8 != 0;
    }
    else {
      bVar15 = true;
    }
    if (pcVar11 != (char *)0x0) {
      local_1d8 = (ArrayPtr<const_char>)ZEXT816(0);
      (**(code **)*local_1c8)(local_1c8,pcVar11,1,puVar12,puVar12,0);
      params_1 = puVar12;
    }
    if ((bool)(bVar15 & kj::_::Debug::minSeverity < 3)) {
      kj::str<char_const(&)[4],unsigned_int&>((String *)&local_1d8,(kj *)"foo",&local_22c,params_1);
      local_228.pointer =
           (WirePointer *)
           ((long)&((WireValue<uint32_t> *)local_208.ptr)->value +
           ((ulong)local_208.step * (ulong)(uint)local_22c >> 3));
      local_228.segment = local_208.segment;
      local_228.capTable = local_208.capTable;
      local_228.nestingLimit = local_208.nestingLimit;
      local_130 = (ArrayPtr<const_char>)
                  PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
      kj::_::Debug::log<char_const(&)[52],kj::String,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x575,ERROR,
                 "\"failed: expected \" \"(kj::str(\\\"foo\\\", i)) == (reader[i])\", kj::str(\"foo\", i), reader[i]"
                 ,(char (*) [52])"failed: expected (kj::str(\"foo\", i)) == (reader[i])",
                 (String *)&local_1d8,(Reader *)&local_130);
      pcVar11 = local_1d8.ptr;
      if (local_1d8.ptr != (char *)0x0) {
        sVar1 = local_1d8.size_;
        local_1d8 = (ArrayPtr<const_char>)ZEXT816(0);
        (**(code **)*local_1c8)(local_1c8,pcVar11,1,sVar1,sVar1);
      }
    }
    local_228.pointer =
         (WirePointer *)
         ((long)&((WireValue<uint32_t> *)local_198.ptr)->value +
         (((ulong)local_198._24_8_ >> 0x20) * (ulong)(uint)local_22c >> 3));
    local_228.segment = &(local_198.segment)->super_SegmentReader;
    local_228.capTable = &(local_198.capTable)->super_CapTableReader;
    pcVar11 = (char *)0x0;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1d8,(PointerBuilder *)&local_228,(void *)0x0,0);
    if (((undefined8 *)0x1 < local_1c8) && (kj::_::Debug::minSeverity < 3)) {
      pcVar11 = "\"failed: expected \" \"builder[i] == nullptr\"";
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x576,ERROR,"\"failed: expected \" \"builder[i] == nullptr\"",
                 (char (*) [39])"failed: expected builder[i] == nullptr");
    }
    local_22c = (char  [4])((int)local_22c + 1);
  } while ((uint)local_22c < 7);
  lVar13 = 7;
  do {
    local_228.pointer =
         (WirePointer *)
         ((long)&((WireValue<uint32_t> *)local_208.ptr)->value +
         ((ulong)local_208.step * lVar13 >> 3));
    local_228.segment = local_208.segment;
    local_228.capTable = local_208.capTable;
    local_228.nestingLimit = local_208.nestingLimit;
    RVar18 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    if ((1 < RVar18.super_StringPtr.content.size_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x579,ERROR,"\"failed: expected \" \"reader[i] == nullptr\"",
                 (char (*) [38])"failed: expected reader[i] == nullptr");
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xb);
  local_228.segment = &(local_198.segment)->super_SegmentReader;
  local_228.capTable = &(local_198.capTable)->super_CapTableReader;
  local_228.pointer = (WirePointer *)local_198.ptr;
  RVar18.super_StringPtr.content.size_ = 4;
  RVar18.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_228,RVar18);
  local_228.segment = local_208.segment;
  local_228.capTable = local_208.capTable;
  local_228.pointer = (WirePointer *)local_208.ptr;
  local_228.nestingLimit = local_208.nestingLimit;
  RVar18 = PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
  if (((RVar18.super_StringPtr.content.size_ != 5) ||
      (*RVar18.super_StringPtr.content.ptr != 0x306f6f66)) && (kj::_::Debug::minSeverity < 3)) {
    local_228.segment = local_208.segment;
    local_228.capTable = local_208.capTable;
    local_228.pointer = (WirePointer *)local_208.ptr;
    local_228.nestingLimit = local_208.nestingLimit;
    local_1d8 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_228,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[41],char_const(&)[5],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x57f,ERROR,
               "\"failed: expected \" \"(\\\"foo0\\\") == (reader[0])\", \"foo0\", reader[0]",
               (char (*) [41])"failed: expected (\"foo0\") == (reader[0])",(char (*) [5])"foo0",
               (Reader *)&local_1d8);
  }
  RVar19 = OrphanBuilder::asDataReader(&local_150);
  if ((*RVar19.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_228.segment = (SegmentReader *)CONCAT44(local_228.segment._4_4_,0x20);
    RVar19 = OrphanBuilder::asDataReader(&local_150);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x581,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_228
               ,RVar19.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  if (local_150.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_150);
  }
  if (local_170.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_170);
  }
  pSVar6 = local_1a8;
  pSVar10 = pSStack_1b0;
  auVar9 = local_1b8;
  if (local_1b8 != (undefined1  [8])0x0) {
    local_1b8 = (undefined1  [8])0x0;
    pSStack_1b0 = (SegmentBuilder *)0x0;
    local_1a8 = (SegmentBuilder *)0x0;
    (*(code *)**(undefined8 **)local_1a0)
              (local_1a0,auVar9,0x20,(long)pSVar10 - (long)auVar9 >> 5,
               (long)pSVar6 - (long)auVar9 >> 5,
               kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::Text>,_false>::destruct);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, ExtendPointerListCopy) {
  MallocMessageBuilder message;

  // Allocate data in advance so that the list itself is at the end of the segment.
  kj::Vector<Orphan<Text>> pointers(7);
  for (uint i = 0; i < 7; i++) {
    pointers.add(message.getOrphanage().newOrphanCopy(Text::Reader(kj::str("foo", i))));
  }

  auto orphan = message.getOrphanage().newOrphan<List<Text>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.adopt(i, kj::mv(pointers[i]));
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(kj::str("foo", i), reader[i]);
    EXPECT_TRUE(builder[i] == nullptr);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_TRUE(reader[i] == nullptr);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, "bar");
  EXPECT_EQ("foo0", reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}